

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool __thiscall ghc::filesystem::path::has_root_path(path *this)

{
  bool bVar1;
  path *unaff_retaddr;
  undefined1 local_9;
  
  bVar1 = has_root_name((path *)0x288867);
  local_9 = true;
  if (!bVar1) {
    local_9 = has_root_directory(unaff_retaddr);
  }
  return local_9;
}

Assistant:

GHC_INLINE bool path::has_root_path() const
{
    return has_root_name() || has_root_directory();
}